

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O2

int __thiscall naiveproxy::init_proxys(naiveproxy *this)

{
  list<naiveconfig_*,_std::allocator<naiveconfig_*>_> *this_00;
  byte bVar1;
  __pid_t _Var2;
  FILE *__stream;
  char *pcVar3;
  byte *pbVar4;
  naiveconfig *pnVar5;
  naiveproxy *pnVar6;
  httpproxy *phVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  byte *str_00;
  byte local_448 [8];
  char str [1024];
  naiveconfig *cfg;
  
  signal(0x11,(__sighandler_t)0x1);
  __stream = fopen("/etc/naiveproxy.conf","r");
  if (__stream == (FILE *)0x0) {
    printf(anon_var_dwarf_10a54,"/etc/naiveproxy.conf");
  }
  else {
    this_00 = &this->cfgs;
    while (pcVar3 = fgets((char *)local_448,0x400,__stream), p_Var9 = (_List_node_base *)this_00,
          pcVar3 != (char *)0x0) {
      pbVar4 = local_448;
      str_00 = local_448;
      while ((pbVar4 = pbVar4 + 1, uVar8 = (ulong)*str_00, uVar8 < 0x21 &&
             ((0x100000600U >> (uVar8 & 0x3f) & 1) != 0))) {
        str_00 = str_00 + 1;
      }
      while (((char)uVar8 != '\0' && ((int)uVar8 != 0x23))) {
        bVar1 = *pbVar4;
        pbVar4 = pbVar4 + 1;
        uVar8 = (ulong)bVar1;
      }
      pbVar4[-1] = 0;
      if (*str_00 != 0) {
        pnVar5 = (naiveconfig *)operator_new(0x38);
        naiveconfig::naiveconfig(pnVar5,(char *)str_00);
        str._1016_8_ = pnVar5;
        std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::push_front
                  (this_00,(value_type *)(str + 0x3f8));
      }
    }
    do {
      while( true ) {
        p_Var9 = (((_List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_> *)&p_Var9->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var9 == (_List_node_base *)this_00) {
          return 0;
        }
        if (this->daemonized == true) break;
        if (*(char *)((long)p_Var9[1]._M_next + 0x14) == '\0') {
          phVar7 = (httpproxy *)operator_new(0x58);
          tcpproxy::tcpproxy((tcpproxy *)phVar7,(naiveconfig *)p_Var9[1]._M_next);
        }
        else {
          phVar7 = (httpproxy *)operator_new(0x90);
          httpproxy::httpproxy(phVar7,(naiveconfig *)p_Var9[1]._M_next);
        }
        (*(phVar7->super_tcpproxy).super_proxy._vptr_proxy[2])();
      }
      _Var2 = fork();
      if (_Var2 == 0) {
        pnVar6 = GetInstance();
        std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::clear(&pnVar6->cfgs);
        pnVar5 = (naiveconfig *)p_Var9[1]._M_next;
        if (pnVar5->protocol == '\0') {
          phVar7 = (httpproxy *)operator_new(0x58);
          tcpproxy::tcpproxy((tcpproxy *)phVar7,pnVar5);
        }
        else {
          phVar7 = (httpproxy *)operator_new(0x90);
          httpproxy::httpproxy(phVar7,pnVar5);
        }
        (*(phVar7->super_tcpproxy).super_proxy._vptr_proxy[2])();
        break;
      }
    } while (-1 < _Var2);
  }
  exit(0);
}

Assistant:

int naiveproxy::init_proxys()
{

    //忽略SIGCHID
    signal(SIGCHLD, SIG_IGN);

    FILE *fp;
    fp = fopen(CONFIG_FILE_NAME, "r");
    if (fp == NULL)
    {
        printf("打开文件%s失败\n", CONFIG_FILE_NAME);
        exit(0);
    }

    char str[1024];

    while (fgets(str, sizeof(str), fp) != NULL)
    {
        char *p_str = str;
        //删除前导空格等
        while (*p_str == ' ' || *p_str == '\t' || *p_str == '\n')
            p_str++;
        //删除注释
        char *p = p_str;
        while (*p && *p != '#')
            p++;
        *p = 0;
        if (*p_str == 0)
            continue;

        naiveconfig *cfg = new naiveconfig(p_str);
        //由于是push_front，所以配置文件可以看做是从下往上处理的
        cfgs.push_front(cfg);
    }

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        if (daemonized)
        {
            pid_t pid;
            pid = fork();
            if (pid == 0)
            {
                //naiveproxy::DestroyInstance();
                naiveproxy::GetInstance()->cfgs.clear();
                //释放父进程打开的文件描述符和申请的cfgs空间。
                // for (int i = 3; i < NOFILE; i++)
                //     close(i);

                proxy *pro = NULL;
                if ((*it)->protocol == PROTOCOL_TCP)
                {
                    pro = new tcpproxy(*it);
                }
                else if ((*it)->protocol == PROTOCOL_UDP)
                {
                }
                else if ((*it)->protocol == PROTOCOL_HTTP)
                {
                    pro = new httpproxy(*it);
                }
                pro->startproxy();
                exit(0);
            }
            else if (pid < 0)
            {
                exit(0);
            }
        }
        else
        {

            proxy *pro = NULL;
            if ((*it)->protocol == PROTOCOL_TCP)
            {
                pro = new tcpproxy(*it);
            }
            else if ((*it)->protocol == PROTOCOL_UDP)
            {
            }
            else if ((*it)->protocol == PROTOCOL_HTTP)
            {
                pro = new httpproxy(*it);
            }
            pro->startproxy();
        }
    }
    return 0;
}